

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::vprint(FILE *f,wstring_view format_str,wformat_args args)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  wchar_t *__ptr;
  size_t __n;
  unsigned_long_long in_RDX;
  basic_buffer<wchar_t> *in_RSI;
  FILE *in_RDI;
  wmemory_buffer buffer;
  allocator<wchar_t> *in_stack_fffffffffffff778;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_stack_fffffffffffff780;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_2
  in_stack_fffffffffffff7c8;
  basic_string_view<wchar_t> in_stack_fffffffffffff7d0;
  allocator<wchar_t> local_819;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> local_818;
  FILE *local_28;
  basic_buffer<wchar_t> *local_10;
  unsigned_long_long uStack_8;
  
  local_28 = in_RDI;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  std::allocator<wchar_t>::allocator();
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  std::allocator<wchar_t>::~allocator(&local_819);
  args_00.field_1.args_ = in_stack_fffffffffffff7c8.args_;
  args_00.types_ = uStack_8;
  internal::vformat_to<wchar_t>(local_10,in_stack_fffffffffffff7d0,args_00);
  this = &local_818;
  __ptr = internal::basic_buffer<wchar_t>::data((basic_buffer<wchar_t> *)this);
  __n = internal::basic_buffer<wchar_t>::size((basic_buffer<wchar_t> *)this);
  fwrite(__ptr,4,__n,local_28);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer(this);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE *f, wstring_view format_str, wformat_args args) {
  wmemory_buffer buffer;
  internal::vformat_to(buffer, format_str, args);
  std::fwrite(buffer.data(), sizeof(wchar_t), buffer.size(), f);
}